

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

void __thiscall
kj::InsertionOrderIndex::moveImpl(InsertionOrderIndex *this,size_t oldPos,size_t newPos)

{
  Link *__s;
  Fault local_50;
  Fault f_1;
  Fault local_38;
  Fault f;
  Link *newLink;
  Link *link;
  size_t newPos_local;
  size_t oldPos_local;
  InsertionOrderIndex *this_local;
  
  __s = this->links + oldPos + 1;
  f.exception = (Exception *)(this->links + newPos + 1);
  ((f.exception)->ownFile).content.ptr = (char *)*__s;
  if ((ulong)this->links[__s->next].prev != oldPos + 1) {
    _::Debug::Fault::Fault
              (&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
               ,0x37d,FAILED,"links[link.next].prev == oldPos + 1","");
    _::Debug::Fault::fatal(&local_38);
  }
  if ((ulong)this->links[__s->prev].next == oldPos + 1) {
    this->links[__s->next].prev = (int)newPos + 1;
    this->links[__s->prev].next = (int)newPos + 1;
    memset(__s,0xff,8);
    return;
  }
  _::Debug::Fault::Fault
            (&local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
             ,0x37e,FAILED,"links[link.prev].next == oldPos + 1","");
  _::Debug::Fault::fatal(&local_50);
}

Assistant:

void InsertionOrderIndex::moveImpl(size_t oldPos, size_t newPos) {
  Link& link = links[oldPos + 1];
  Link& newLink = links[newPos + 1];

  newLink = link;

  KJ_DASSERT(links[link.next].prev == oldPos + 1);
  KJ_DASSERT(links[link.prev].next == oldPos + 1);
  links[link.next].prev = newPos + 1;
  links[link.prev].next = newPos + 1;

#ifdef KJ_DEBUG
  memset(&link, 0xff, sizeof(Link));
#endif
}